

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

DOMNode * __thiscall xercesc_4_0::DOMDocumentImpl::cloneNode(DOMDocumentImpl *this,bool deep)

{
  int iVar1;
  DOMDocumentImpl *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar2;
  DOMNode *dst;
  
  this_00 = (DOMDocumentImpl *)XMemory::operator_new(0x178,this->fMemoryManager);
  DOMDocumentImpl(this_00,this->fDOMImplementation,this->fMemoryManager);
  if ((this->fXmlEncoding != (XMLCh *)0x0) && (*this->fXmlEncoding != L'\0')) {
    iVar1 = (*(this_00->super_DOMMemoryManager)._vptr_DOMMemoryManager[7])(this_00);
    this_00->fXmlEncoding = (XMLCh *)CONCAT44(extraout_var,iVar1);
  }
  if ((this->fXmlVersion != (XMLCh *)0x0) && (*this->fXmlVersion != L'\0')) {
    (*(this_00->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x5b])(this_00);
  }
  (*(this_00->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x59])
            (this_00,(ulong)this->fXmlStandalone);
  if (deep) {
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[0xc])(this);
    for (plVar2 = (long *)CONCAT44(extraout_var_00,iVar1); plVar2 != (long *)0x0;
        plVar2 = (long *)(**(code **)(*plVar2 + 0x50))(plVar2)) {
      iVar1 = (*(this_00->super_DOMMemoryManager)._vptr_DOMMemoryManager[100])(this_00,plVar2,1,1);
      (*(this_00->super_DOMMemoryManager)._vptr_DOMMemoryManager[8])
                (this_00,CONCAT44(extraout_var_01,iVar1));
    }
  }
  dst = &(this_00->super_DOMDocument).super_DOMNode;
  DOMNodeImpl::callUserDataHandlers
            (&this->fNode,NODE_CLONED,&(this->super_DOMDocument).super_DOMNode,dst);
  return dst;
}

Assistant:

DOMNode *DOMDocumentImpl::cloneNode(bool deep) const {

    // Note:  the cloned document node goes on the same heap we live in.
    DOMDocumentImpl *newdoc = new (fMemoryManager) DOMDocumentImpl(fDOMImplementation, fMemoryManager);
    if(fXmlEncoding && *fXmlEncoding)
        newdoc->setXmlEncoding(fXmlEncoding);
    if(fXmlVersion && *fXmlVersion)
        newdoc->setXmlVersion(fXmlVersion);
    newdoc->setXmlStandalone(fXmlStandalone);

    // then the children by _importing_ them
    if (deep)
        for (DOMNode *n = this->getFirstChild(); n != 0; n = n->getNextSibling()) {
            newdoc->appendChild(newdoc->importNode(n, true, true));
    }

    fNode.callUserDataHandlers(DOMUserDataHandler::NODE_CLONED, this, newdoc);
    return newdoc;
}